

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManPrintBoxInfoSorted(Au_Ntk_t *pNtk)

{
  void **__src;
  int iVar1;
  Au_Man_t *pAVar2;
  void **ppvVar3;
  Vec_Ptr_t *p;
  void **__dest;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  pAVar2 = pNtk->pMan;
  if (pAVar2 != (Au_Man_t *)0x0) {
    iVar5 = (pAVar2->vNtks).nSize;
    uVar7 = (long)iVar5 - 1;
    iVar6 = (int)uVar7;
    (pAVar2->vNtks).nSize = iVar6;
    ppvVar3 = (pAVar2->vNtks).pArray;
    __src = ppvVar3 + 1;
    (pAVar2->vNtks).pArray = __src;
    p = (Vec_Ptr_t *)malloc(0x10);
    p->nSize = iVar6;
    iVar1 = (pAVar2->vNtks).nCap;
    p->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar1 << 3);
    }
    p->pArray = __dest;
    memcpy(__dest,__src,uVar7 * 8);
    (pAVar2->vNtks).pArray = ppvVar3;
    (pAVar2->vNtks).nSize = iVar5;
    if (2 < iVar5) {
      qsort(__dest,uVar7 & 0xffffffff,8,Au_NtkCompareSign);
    }
    for (iVar5 = 1; iVar5 < iVar6; iVar5 = iVar5 + 1) {
      puVar4 = (undefined8 *)Vec_PtrEntry(p,iVar5);
      printf("MODULE  ");
      printf("%-30s : ",*puVar4);
      printf("PI=%6d ",(ulong)*(uint *)(puVar4 + 10));
      printf("PO=%6d ",(ulong)*(uint *)((long)puVar4 + 0x54));
      printf("BB=%6d ",(ulong)*(uint *)(puVar4 + 0xc));
      printf("ND=%6d ",(ulong)*(uint *)((long)puVar4 + 100));
      putchar(10);
    }
    Vec_PtrFree(p);
    return;
  }
  puts("There is no hierarchy information.");
  return;
}

Assistant:

void Au_ManPrintBoxInfoSorted( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vModsNew;
    Au_Ntk_t * pModel;
    int i;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

    vMods->nSize--;
    vMods->pArray++;
    vModsNew = Vec_PtrDup( vMods );
    vMods->pArray--;
    vMods->nSize++;

    Vec_PtrSort( vModsNew, (int(*)())Au_NtkCompareSign );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vModsNew, pModel, i, 1 )
    {
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
        printf( "\n" );
    }
    Vec_PtrFree( vModsNew );
}